

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  PagerSavepoint *pPVar1;
  sqlite3_io_methods *psVar2;
  Wal *pWVar3;
  u32 *puVar4;
  PgHdr *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  u32 uVar11;
  u32 uVar12;
  u32 uVar13;
  int iVar14;
  uint uVar15;
  PgHdr *pPVar16;
  Pgno *pPVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  PagerSavepoint *pPVar22;
  ulong uVar23;
  long lVar24;
  i64 *piVar25;
  Bitvec *local_58;
  ulong local_48;
  PagerSavepoint *local_40;
  u32 dummy;
  
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  iVar14 = pPager->nSavepoint;
  if (iVar14 <= iSavepoint) {
    return 0;
  }
  iVar18 = (uint)(op != 1) + iSavepoint;
  lVar20 = (long)iVar18;
  lVar24 = lVar20 * 0x30 + 0x10;
  for (lVar21 = lVar20; lVar21 < iVar14; lVar21 = lVar21 + 1) {
    sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar24 + -0x20));
    iVar14 = pPager->nSavepoint;
    lVar24 = lVar24 + 0x30;
  }
  pPager->nSavepoint = iVar18;
  if (op == 1) {
    if (iVar18 != 0) {
      return 0;
    }
    psVar2 = pPager->sjfd->pMethods;
    if (psVar2 == (sqlite3_io_methods *)0x0) {
      return 0;
    }
    iVar14 = 0;
    if (psVar2 == &MemJournalMethods) {
      iVar14 = memjrnlTruncate(pPager->sjfd,0);
    }
    pPager->nSubRec = 0;
    return iVar14;
  }
  if ((pPager->pWal == (Wal *)0x0) && (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
    return 0;
  }
  if (iVar18 == 0) {
LAB_00133585:
    pPVar17 = &pPager->dbOrigSize;
    bVar10 = true;
    local_58 = (Bitvec *)0x0;
    pPVar22 = (PagerSavepoint *)0x0;
  }
  else {
    pPVar1 = pPager->aSavepoint;
    pPVar22 = pPVar1 + lVar20 + -1;
    if (pPVar22 == (PagerSavepoint *)0x0) goto LAB_00133585;
    local_58 = sqlite3BitvecCreate(pPVar1[lVar20 + -1].nOrig);
    if (local_58 == (Bitvec *)0x0) {
      return 7;
    }
    pPVar17 = &pPVar1[lVar20 + -1].nOrig;
    bVar10 = false;
  }
  pPager->dbSize = *pPVar17;
  pPager->changeCountDone = pPager->tempFile;
  local_40 = pPVar22;
  if (bVar10) {
    pWVar3 = pPager->pWal;
    if (pWVar3 != (Wal *)0x0) {
      pPager->dbSize = pPager->dbOrigSize;
      if (pWVar3->writeLock == '\0') {
        iVar14 = 0;
      }
      else {
        uVar15 = (pWVar3->hdr).mxFrame;
        puVar4 = *pWVar3->apWiData;
        uVar12 = puVar4[0];
        uVar13 = puVar4[1];
        uVar6 = *(undefined8 *)(puVar4 + 2);
        uVar11 = puVar4[5];
        uVar7 = *(undefined8 *)(puVar4 + 6);
        uVar8 = *(undefined8 *)(puVar4 + 8);
        uVar9 = *(undefined8 *)(puVar4 + 10);
        (pWVar3->hdr).mxFrame = puVar4[4];
        (pWVar3->hdr).nPage = uVar11;
        *(undefined8 *)(pWVar3->hdr).aFrameCksum = uVar7;
        (pWVar3->hdr).iVersion = uVar12;
        (pWVar3->hdr).unused = uVar13;
        (pWVar3->hdr).iChange = (int)uVar6;
        (pWVar3->hdr).isInit = (char)((ulong)uVar6 >> 0x20);
        (pWVar3->hdr).bigEndCksum = (char)((ulong)uVar6 >> 0x28);
        (pWVar3->hdr).szPage = (short)((ulong)uVar6 >> 0x30);
        *(undefined8 *)(pWVar3->hdr).aSalt = uVar8;
        *(undefined8 *)(pWVar3->hdr).aCksum = uVar9;
        iVar14 = 0;
        for (uVar19 = (pWVar3->hdr).mxFrame + 0x1001; (iVar14 == 0 && (uVar19 - 0x1000 <= uVar15));
            uVar19 = uVar19 + 1) {
          if (((ulong)uVar19 + 0xffffffff021 & 0xffffffff000) == 0) {
            pPVar17 = *pWVar3->apWiData + (ulong)(uVar19 - 0x1000) + 0x21;
          }
          else {
            pPVar17 = (Pgno *)((ulong)((uVar19 - 0xfdf & 0xfff) << 2) +
                              (long)pWVar3->apWiData[(int)((ulong)uVar19 + 0xffffffff021 >> 0xc)]);
          }
          iVar14 = pagerUndoCallback(pPager,*pPVar17);
        }
        if (uVar15 != (pWVar3->hdr).mxFrame) {
          walCleanupHash(pWVar3);
        }
      }
      pPVar16 = sqlite3PcacheDirtyList(pPager->pPCache);
      while( true ) {
        if (pPVar16 == (PgHdr *)0x0) {
          return iVar14;
        }
        if (iVar14 != 0) break;
        pPVar5 = pPVar16->pDirty;
        iVar14 = pagerUndoCallback(pPager,pPVar16->pgno);
        pPVar16 = pPVar5;
      }
      return iVar14;
    }
    lVar24 = pPager->journalOff;
  }
  else {
    piVar25 = &pPager->journalOff;
    lVar24 = pPager->journalOff;
    if (pPager->pWal == (Wal *)0x0) {
      lVar21 = pPVar22->iHdrOffset;
      if (pPVar22->iHdrOffset == 0) {
        lVar21 = lVar24;
      }
      *piVar25 = pPVar22->iOffset;
      iVar14 = 0;
      while (iVar14 == 0) {
        if (lVar21 <= *piVar25) {
          iVar14 = 0;
          break;
        }
        iVar14 = pager_playback_one_page(pPager,piVar25,local_58,1,1);
      }
      goto LAB_00133744;
    }
  }
  pPager->journalOff = 0;
  iVar14 = 0;
LAB_00133744:
  piVar25 = &pPager->journalOff;
  while ((pPVar1 = local_40, iVar14 == 0 && (*piVar25 < lVar24))) {
    local_48 = local_48 & 0xffffffff00000000;
    iVar14 = readJournalHdr(pPager,0,lVar24,(u32 *)&local_48,&dummy);
    uVar15 = (uint)local_48;
    if ((uint)local_48 == 0) {
      lVar21 = (ulong)pPager->sectorSize + pPager->journalHdr;
      uVar15 = 0;
      if (lVar21 == pPager->journalOff) {
        uVar15 = (uint)((lVar24 - lVar21) / ((long)pPager->pageSize + 8));
      }
    }
    uVar19 = 0;
    while (((iVar14 == 0 && (uVar19 < uVar15)) && (*piVar25 < lVar24))) {
      iVar14 = pager_playback_one_page(pPager,piVar25,local_58,1,1);
      uVar19 = uVar19 + 1;
    }
  }
  if (!bVar10) {
    uVar23 = (ulong)local_40->iSubRec;
    local_48 = ((long)pPager->pageSize + 4) * uVar23;
    pWVar3 = pPager->pWal;
    if (pWVar3 != (Wal *)0x0) {
      if (local_40->aWalData[3] == pWVar3->nCkpt) {
        uVar15 = local_40->aWalData[0];
      }
      else {
        local_40->aWalData[0] = 0;
        local_40->aWalData[3] = pWVar3->nCkpt;
        uVar15 = 0;
      }
      iVar14 = 0;
      if (uVar15 < (pWVar3->hdr).mxFrame) {
        (pWVar3->hdr).mxFrame = uVar15;
        (pWVar3->hdr).aFrameCksum[0] = local_40->aWalData[1];
        (pWVar3->hdr).aFrameCksum[1] = local_40->aWalData[2];
        walCleanupHash(pWVar3);
        uVar23 = (ulong)pPVar1->iSubRec;
      }
    }
    for (; (iVar14 == 0 && ((uint)uVar23 < pPager->nSubRec)); uVar23 = (ulong)((uint)uVar23 + 1)) {
      iVar14 = pager_playback_one_page(pPager,(i64 *)&local_48,local_58,0,1);
    }
  }
  sqlite3BitvecDestroy(local_58);
  if (iVar14 == 0) {
    *piVar25 = lVar24;
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;
  
#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated 
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* If this is a release of the outermost savepoint, truncate 
    ** the sub-journal to zero bytes in size. */
    if( op==SAVEPOINT_RELEASE ){
      if( nNew==0 && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          rc = sqlite3OsTruncate(pPager->sjfd, 0);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = 0;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }
    
#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled 
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if( 
        pPager->journalMode==PAGER_JOURNALMODE_OFF 
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}